

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O0

int test_typed_empty_monster(flatcc_builder_t *B)

{
  size_t bufsiz;
  MyGame_Example_Monster_ref_t root_00;
  flatbuffers_thash_t fVar1;
  flatbuffers_thash_t fVar2;
  int iVar3;
  void *addr;
  char *pcVar4;
  char local_2c [4];
  size_t sStack_28;
  flatbuffers_fid_t fid;
  size_t size;
  void *buffer;
  MyGame_Example_Monster_ref_t root;
  int ret;
  flatcc_builder_t *B_local;
  
  buffer._4_4_ = -1;
  memset(local_2c,0,4);
  flatcc_builder_reset(B);
  flatbuffers_buffer_start(B,anon_var_dwarf_1b6);
  MyGame_Example_Monster_start(B);
  MyGame_Example_Monster_name_create_str(B,"MyMonster");
  root_00 = MyGame_Example_Monster_end(B);
  flatbuffers_buffer_end(B,root_00);
  addr = flatcc_builder_finalize_aligned_buffer(B,&stack0xffffffffffffffd8);
  hexdump("empty typed monster table",addr,sStack_28,_stderr);
  fVar1 = flatbuffers_get_type_hash(addr);
  fVar2 = flatbuffers_type_hash_from_name("MyGame.Example.Monster");
  if (fVar1 == fVar2) {
    iVar3 = flatbuffers_has_type_hash(addr,0x330ef481);
    if (iVar3 == 0) {
      printf("Monster does not have the expected type\n");
    }
    else {
      iVar3 = flatbuffers_has_type_hash(addr,0x330ef481);
      if (iVar3 == 0) {
        printf("Monster does not have the expected type\n");
      }
      else {
        iVar3 = verify_empty_monster(addr);
        if (iVar3 == 0) {
          printf("typed empty monster should not verify with default identifier\n");
        }
        else {
          buffer._4_4_ = MyGame_Example_Monster_verify_as_root_with_identifier
                                   (addr,sStack_28,anon_var_dwarf_1b6);
          if (buffer._4_4_ == 0) {
            buffer._4_4_ = MyGame_Example_Monster_verify_as_typed_root(addr,sStack_28);
            if (buffer._4_4_ == 0) {
              buffer._4_4_ = MyGame_Example_Monster_verify_as_root_with_type_hash
                                       (addr,sStack_28,0x330ef481);
              bufsiz = sStack_28;
              if (buffer._4_4_ == 0) {
                fVar1 = flatbuffers_type_hash_from_name("MyGame.Example.Monster");
                buffer._4_4_ = MyGame_Example_Monster_verify_as_root_with_type_hash
                                         (addr,bufsiz,fVar1);
                if (buffer._4_4_ == 0) {
                  flatbuffers_identifier_from_type_hash(0x330ef481,local_2c);
                  buffer._4_4_ = MyGame_Example_Monster_verify_as_root_with_identifier
                                           (addr,sStack_28,local_2c);
                  if (buffer._4_4_ == 0) {
                    iVar3 = MyGame_Example_Monster_verify_as_root(addr,sStack_28);
                    if (iVar3 == 0) {
                      printf(
                            "should not have verified with the original identifier since we use types\n"
                            );
                    }
                    else {
                      buffer._4_4_ = 0;
                    }
                  }
                  else {
                    pcVar4 = flatcc_verify_error_string(buffer._4_4_);
                    printf("could not verify typed empty monster, got %s\n",pcVar4);
                  }
                }
                else {
                  pcVar4 = flatcc_verify_error_string(buffer._4_4_);
                  printf("could not verify empty monster with explicit type hash, got %s\n",pcVar4);
                }
              }
              else {
                pcVar4 = flatcc_verify_error_string(buffer._4_4_);
                printf("could not verify empty monster with type hash, got %s\n",pcVar4);
              }
            }
            else {
              pcVar4 = flatcc_verify_error_string(buffer._4_4_);
              printf("could not verify typed empty monster, got %s\n",pcVar4);
            }
          }
          else {
            pcVar4 = flatcc_verify_error_string(buffer._4_4_);
            printf("could not verify typed empty monster, got %s\n",pcVar4);
          }
        }
      }
    }
  }
  else {
    fVar1 = flatbuffers_get_type_hash(addr);
    printf("Monster does not have the expected type, got %lx\n",(ulong)fVar1);
  }
  flatcc_builder_aligned_free(addr);
  return buffer._4_4_;
}

Assistant:

int test_typed_empty_monster(flatcc_builder_t *B)
{
    int ret = -1;
    ns(Monster_ref_t) root;
    void *buffer;
    size_t size;
    flatbuffers_fid_t fid = { 0 };

    flatcc_builder_reset(B);

    flatbuffers_buffer_start(B, ns(Monster_type_identifier));
    ns(Monster_start(B));
    /* Cannot make monster empty as name is required. */
    ns(Monster_name_create_str(B, "MyMonster"));
    root = ns(Monster_end(B));
    flatbuffers_buffer_end(B, root);


    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);

    hexdump("empty typed monster table", buffer, size, stderr);

    if (flatbuffers_get_type_hash(buffer) != flatbuffers_type_hash_from_name("MyGame.Example.Monster")) {

        printf("Monster does not have the expected type, got %lx\n", (unsigned long)flatbuffers_get_type_hash(buffer));
        goto done;
    }

    if (!flatbuffers_has_type_hash(buffer, ns(Monster_type_hash))) {
        printf("Monster does not have the expected type\n");
        goto done;
    }
    if (!flatbuffers_has_type_hash(buffer, 0x330ef481)) {
        printf("Monster does not have the expected type\n");
        goto done;
    }

    if (!verify_empty_monster(buffer)) {
        printf("typed empty monster should not verify with default identifier\n");
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, ns(Monster_type_identifier))))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_typed_root(buffer, size)))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_type_hash(buffer, size, ns(Monster_type_hash))))) {
        printf("could not verify empty monster with type hash, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_type_hash(buffer, size, flatbuffers_type_hash_from_name("MyGame.Example.Monster"))))) {
        printf("could not verify empty monster with explicit type hash, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    flatbuffers_identifier_from_type_hash(0x330ef481, fid);
    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, fid)))) {
        printf("could not verify typed empty monster, got %s\n", flatcc_verify_error_string(ret));
        goto done;
    }

    if (!ns(Monster_verify_as_root(buffer, size))) {
        printf("should not have verified with the original identifier since we use types\n");
        goto done;
    }
    ret = 0;

done:
    flatcc_builder_aligned_free(buffer);
    return ret;
}